

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

rdr_t * rdr_new(_Bool autouni)

{
  rdr_t *prVar1;
  qrk_t *pqVar2;
  
  prVar1 = (rdr_t *)xmalloc(0x30);
  prVar1->autouni = autouni;
  prVar1->pats = (pat_t **)0x0;
  prVar1->npats = 0;
  prVar1->nuni = 0;
  prVar1->nbi = 0;
  prVar1->ntoks = 0;
  pqVar2 = qrk_new();
  prVar1->lbl = pqVar2;
  pqVar2 = qrk_new();
  prVar1->obs = pqVar2;
  return prVar1;
}

Assistant:

rdr_t *rdr_new(bool autouni) {
	rdr_t *rdr = xmalloc(sizeof(rdr_t));
	rdr->autouni = autouni;
	rdr->npats = rdr->nuni = rdr->nbi = 0;
	rdr->ntoks = 0;
	rdr->pats = NULL;
	rdr->lbl = qrk_new();
	rdr->obs = qrk_new();
	return rdr;
}